

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utxo_snapshot.cpp
# Opt level: O1

bool node::WriteSnapshotBaseBlockhash(Chainstate *snapshot_chainstate)

{
  __uniq_ptr_data<CDBWrapper,_std::default_delete<CDBWrapper>,_true,_true> _Var1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  FILE *__stream;
  int iVar2;
  unique_ptr<CoinsViews,_std::default_delete<CoinsViews>_> *puVar3;
  FILE *file;
  char *__n;
  bool bVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  void *pvVar5;
  long lVar6;
  AutoFile afile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  path local_a0;
  path write_to;
  path local_50;
  char local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((snapshot_chainstate->m_from_snapshot_blockhash).super__Optional_base<uint256,_true,_true>.
      _M_payload.super__Optional_payload_base<uint256>._M_engaged == false) {
    __assert_fail("snapshot_chainstate.m_from_snapshot_blockhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
                  ,0x1a,"bool node::WriteSnapshotBaseBlockhash(Chainstate &)");
  }
  __n = "CoinsDB";
  puVar3 = inline_assertion_check<true,std::unique_ptr<CoinsViews,std::default_delete<CoinsViews>>&>
                     (&snapshot_chainstate->m_coins_views,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.h"
                      ,0x271,"CoinsDB","m_coins_views");
  _Var1.super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t.
  super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
  super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl =
       (((puVar3->_M_t).super___uniq_ptr_impl<CoinsViews,_std::default_delete<CoinsViews>_>._M_t.
         super__Tuple_impl<0UL,_CoinsViews_*,_std::default_delete<CoinsViews>_>.
         super__Head_base<0UL,_CoinsViews_*,_false>._M_head_impl)->m_dbview).m_db._M_t.
       super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>;
  local_28 = *(char *)((long)_Var1.
                             super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                             super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x68) == '\0'
  ;
  if (!(bool)local_28) {
    __assert_fail("chaindir",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
                  ,0x1d,"bool node::WriteSnapshotBaseBlockhash(Chainstate &)");
  }
  std::filesystem::__cxx11::path::path
            (&local_50,
             (path *)((long)_Var1.
                            super___uniq_ptr_impl<CDBWrapper,_std::default_delete<CDBWrapper>_>._M_t
                            .super__Tuple_impl<0UL,_CDBWrapper_*,_std::default_delete<CDBWrapper>_>.
                            super__Head_base<0UL,_CDBWrapper_*,_false>._M_head_impl + 0x40));
  std::filesystem::__cxx11::path::path(&local_a0,&local_50);
  std::filesystem::__cxx11::path::operator/=(&local_a0,(path *)SNAPSHOT_BLOCKHASH_FILENAME);
  std::filesystem::__cxx11::path::path(&write_to.super_path,&local_a0);
  std::filesystem::__cxx11::path::~path(&local_a0);
  file = fsbridge::fopen((char *)&write_to.super_path,"wb");
  pvVar5 = (void *)0x0;
  lVar6 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&afile,(FILE *)file,data_xor);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,lVar6 - (long)pvVar5);
  }
  if (afile.m_file == (FILE *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,write_to.super_path._M_pathname._M_dataplus._M_p,
               write_to.super_path._M_pathname._M_dataplus._M_p +
               write_to.super_path._M_pathname._M_string_length);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file_00._M_len = 0x66;
    logging_function_00._M_str = "WriteSnapshotBaseBlockhash";
    logging_function_00._M_len = 0x1a;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x24,ALL,Info,(ConstevalFormatString<1U>)0xfb911a,
               &local_c0);
  }
  else {
    AutoFile::write(&afile,(int)snapshot_chainstate + 0x70,(void *)0x20,(size_t)__n);
    __stream = afile.m_file;
    afile.m_file = (FILE *)0x0;
    bVar4 = true;
    if ((__stream == (FILE *)0x0) || (iVar2 = fclose((FILE *)__stream), iVar2 == 0))
    goto LAB_00984ae8;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,write_to.super_path._M_pathname._M_dataplus._M_p,
               write_to.super_path._M_pathname._M_dataplus._M_p +
               write_to.super_path._M_pathname._M_string_length);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/utxo_snapshot.cpp"
    ;
    source_file._M_len = 0x66;
    logging_function._M_str = "WriteSnapshotBaseBlockhash";
    logging_function._M_len = 0x1a;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x2b,ALL,Info,(ConstevalFormatString<1U>)0xfb9159,
               &local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  bVar4 = false;
LAB_00984ae8:
  AutoFile::~AutoFile(&afile);
  std::filesystem::__cxx11::path::~path(&write_to.super_path);
  if (local_28 == '\x01') {
    local_28 = '\0';
    std::filesystem::__cxx11::path::~path(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool WriteSnapshotBaseBlockhash(Chainstate& snapshot_chainstate)
{
    AssertLockHeld(::cs_main);
    assert(snapshot_chainstate.m_from_snapshot_blockhash);

    const std::optional<fs::path> chaindir = snapshot_chainstate.CoinsDB().StoragePath();
    assert(chaindir); // Sanity check that chainstate isn't in-memory.
    const fs::path write_to = *chaindir / node::SNAPSHOT_BLOCKHASH_FILENAME;

    FILE* file{fsbridge::fopen(write_to, "wb")};
    AutoFile afile{file};
    if (afile.IsNull()) {
        LogPrintf("[snapshot] failed to open base blockhash file for writing: %s\n",
                  fs::PathToString(write_to));
        return false;
    }
    afile << *snapshot_chainstate.m_from_snapshot_blockhash;

    if (afile.fclose() != 0) {
        LogPrintf("[snapshot] failed to close base blockhash file %s after writing\n",
                  fs::PathToString(write_to));
        return false;
    }
    return true;
}